

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O2

void __thiscall amrex::TagBoxArray::mapPeriodicRemoveDuplicates(TagBoxArray *this,Geometry *geom)

{
  Periodicity *period;
  long lVar1;
  long lVar2;
  long lVar3;
  Periodicity PVar4;
  FabArray<amrex::IArrayBox> *local_2c0;
  TagBoxArray *local_2b8;
  Box local_2ac;
  Array4<const_int> local_290;
  Array4<char> local_250;
  MFIter mfi;
  TagBoxArray tmp;
  
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       *(__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         *)(this->super_FabArray<amrex::TagBox>).super_FabArrayBase.n_grow.vect;
  mfi.fabArray._0_4_ = (this->super_FabArray<amrex::TagBox>).super_FabArrayBase.n_grow.vect[2];
  TagBoxArray((TagBoxArray *)&tmp.super_FabArray<amrex::TagBox>,
              &(this->super_FabArray<amrex::TagBox>).super_FabArrayBase.boxarray,
              &(this->super_FabArray<amrex::TagBox>).super_FabArrayBase.distributionMap,
              (IntVect *)&mfi);
  local_250.p = *(char **)(this->super_FabArray<amrex::TagBox>).super_FabArrayBase.n_grow.vect;
  local_250.jstride._0_4_ = (this->super_FabArray<amrex::TagBox>).super_FabArrayBase.n_grow.vect[2];
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       local_250.p;
  mfi.fabArray._0_4_ = (int)local_250.jstride;
  PVar4 = Geometry::periodicity(geom);
  local_290.p = PVar4.period.vect._0_8_;
  local_290.jstride._0_4_ = PVar4.period.vect[2];
  FabArray<amrex::TagBox>::ParallelAdd
            (&tmp.super_FabArray<amrex::TagBox>,&this->super_FabArray<amrex::TagBox>,0,0,1,
             (IntVect *)&mfi,(IntVect *)&local_250,(Periodicity *)&local_290);
  period = Periodicity::NonPeriodic();
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       *(__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         *)(this->super_FabArray<amrex::TagBox>).super_FabArrayBase.n_grow.vect;
  mfi.fabArray._0_4_ = (this->super_FabArray<amrex::TagBox>).super_FabArrayBase.n_grow.vect[2];
  OwnerMask((amrex *)&local_2c0,(FabArrayBase *)&tmp,period,(IntVect *)&mfi);
  local_2b8 = this;
  MFIter::MFIter(&mfi,(FabArrayBase *)&tmp,'\0');
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::fabbox(&local_2ac,&mfi);
    FabArray<amrex::TagBox>::array<amrex::TagBox,_0>
              (&local_250,&tmp.super_FabArray<amrex::TagBox>,&mfi);
    FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>(&local_290,local_2c0,&mfi);
    for (lVar3 = (long)local_2ac.smallend.vect[2]; lVar1 = (long)local_2ac.smallend.vect[1],
        (int)lVar3 <= local_2ac.bigend.vect[2]; lVar3 = lVar3 + 1) {
      for (; lVar2 = (long)local_2ac.smallend.vect[0], (int)lVar1 <= local_2ac.bigend.vect[1];
          lVar1 = lVar1 + 1) {
        for (; (int)lVar2 <= local_2ac.bigend.vect[0]; lVar2 = lVar2 + 1) {
          if (local_290.p
              [((lVar3 - local_290.begin.z) * local_290.kstride +
               (lVar1 - local_290.begin.y) *
               CONCAT44(local_290.jstride._4_4_,(int)local_290.jstride) + lVar2) -
               (long)local_290.begin.x] == 0) {
            *(undefined1 *)
             ((long)local_250.p +
             lVar2 + (((lVar1 - local_250.begin.y) *
                       CONCAT44(local_250.jstride._4_4_,(int)local_250.jstride) +
                      (lVar3 - local_250.begin.z) * local_250.kstride) - (long)local_250.begin.x)) =
                 0;
          }
        }
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  std::swap<amrex::TagBoxArray>(local_2b8,&tmp);
  if (local_2c0 != (FabArray<amrex::IArrayBox> *)0x0) {
    (*(local_2c0->super_FabArrayBase)._vptr_FabArrayBase[1])();
  }
  FabArray<amrex::TagBox>::~FabArray(&tmp.super_FabArray<amrex::TagBox>);
  return;
}

Assistant:

void
TagBoxArray::mapPeriodicRemoveDuplicates (const Geometry& geom)
{
    BL_PROFILE("TagBoxArray::mapPRD");

    if (Gpu::inLaunchRegion())
    {
        // There is not atomicAdd for char.  So we have to use int.
        iMultiFab itag = amrex::cast<iMultiFab>(*this);
        iMultiFab tmp(boxArray(),DistributionMap(),1,nGrowVect());
        tmp.setVal(0);
        tmp.ParallelAdd(itag, 0, 0, 1, nGrowVect(), nGrowVect(), geom.periodicity());

        // We need to keep tags in periodic boundary
        const auto owner_mask = amrex::OwnerMask(tmp, Periodicity::NonPeriodic(), nGrowVect());
        for (MFIter mfi(tmp); mfi.isValid(); ++mfi) {
            Box const& box = mfi.fabbox();
            Array4<TagType> const& tag =this->array(mfi);
            Array4<int const> const& tmptag = tmp.const_array(mfi);
            Array4<int const> const& msk = owner_mask->const_array(mfi);
            amrex::ParallelFor(box,
            [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
                if (msk(i,j,k)) {
                    tag(i,j,k) = static_cast<char>(tmptag(i,j,k));
                } else {
                    tag(i,j,k) = TagBox::CLEAR;
                }
            });
        }
    }
    else
    {
        TagBoxArray tmp(boxArray(),DistributionMap(),nGrowVect()); // note that tmp is filled w/ CLEAR.
        tmp.ParallelAdd(*this, 0, 0, 1, nGrowVect(), nGrowVect(), geom.periodicity());

        // We need to keep tags in periodic boundary
        const auto owner_mask = amrex::OwnerMask(tmp, Periodicity::NonPeriodic(), nGrowVect());
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(tmp); mfi.isValid(); ++mfi) {
            Box const& box = mfi.fabbox();
            Array4<TagType> const& tag = tmp.array(mfi);
            Array4<int const> const& msk = owner_mask->const_array(mfi);
            AMREX_LOOP_3D(box, i, j, k,
            {
                if (!msk(i,j,k)) tag(i,j,k) = TagBox::CLEAR;
            });
        }

        std::swap(*this, tmp);
    }
}